

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_server.hpp
# Opt level: O3

Lazy<void> __thiscall
cinatra::coro_http_server::start_one
          (coro_http_server *this,shared_ptr<cinatra::coro_http_connection> *conn)

{
  __atomic_base<unsigned_long> _Var1;
  _Head_base<0UL,_coro_io::io_context_pool_*,_false> _Var2;
  undefined8 *in_RDX;
  
  _Var2._M_head_impl = (io_context_pool *)operator_new(0x58,(nothrow_t *)&std::nothrow);
  if (_Var2._M_head_impl == (io_context_pool *)0x0) {
    (this->pool_)._M_t.
    super___uniq_ptr_impl<coro_io::io_context_pool,_std::default_delete<coro_io::io_context_pool>_>.
    _M_t.
    super__Tuple_impl<0UL,_coro_io::io_context_pool_*,_std::default_delete<coro_io::io_context_pool>_>
    .super__Head_base<0UL,_coro_io::io_context_pool_*,_false>._M_head_impl = (io_context_pool *)0x0;
  }
  else {
    *(code **)&(_Var2._M_head_impl)->io_contexts_ = start_one;
    *(code **)((long)&(_Var2._M_head_impl)->io_contexts_ + 8) = start_one;
    _Var1._M_i = ((__atomic_base<unsigned_long> *)(in_RDX + 1))->_M_i;
    *(pointer *)((long)&(_Var2._M_head_impl)->work_ + 0x10) = (pointer)*in_RDX;
    ((_Var2._M_head_impl)->next_io_context_).super___atomic_base<unsigned_long> =
         (__atomic_base<unsigned_long>)_Var1._M_i;
    *in_RDX = 0;
    in_RDX[1] = 0;
    *(pointer *)((long)&(_Var2._M_head_impl)->executors + 8) = (pointer)0x0;
    *(pointer *)((long)&(_Var2._M_head_impl)->executors + 0x10) = (pointer)0x0;
    *(pointer *)((long)&(_Var2._M_head_impl)->io_contexts_ + 0x10) = (pointer)0x0;
    *(undefined8 *)
     &((_Var2._M_head_impl)->executors).
      super__Vector_base<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>,_std::allocator<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>_>_>
         = 0;
    (this->pool_)._M_t.
    super___uniq_ptr_impl<coro_io::io_context_pool,_std::default_delete<coro_io::io_context_pool>_>.
    _M_t.
    super__Tuple_impl<0UL,_coro_io::io_context_pool_*,_std::default_delete<coro_io::io_context_pool>_>
    .super__Head_base<0UL,_coro_io::io_context_pool_*,_false>._M_head_impl = _Var2._M_head_impl;
    *(undefined1 *)&((_Var2._M_head_impl)->promise_)._M_future = 0;
  }
  return (LazyBase<void,_false>)(LazyBase<void,_false>)this;
}

Assistant:

async_simple::coro::Lazy<void> start_one(
      std::shared_ptr<coro_http_connection> conn) noexcept {
    co_await conn->start();
  }